

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O2

bool __thiscall Refal2::CArbitraryInteger::SetValueByText(CArbitraryInteger *this,string *text)

{
  byte bVar1;
  pointer puVar2;
  size_type sVar3;
  byte *pbVar4;
  int iVar5;
  TDigit digit;
  TDigit digit_00;
  byte *pbVar6;
  CArbitraryInteger local_50;
  
  puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2;
  }
  this->isNegative = false;
  sVar3 = text->_M_string_length;
  if (sVar3 != 0) {
    pbVar4 = (byte *)(text->_M_dataplus)._M_p;
    bVar1 = *pbVar4;
    if ((bVar1 == 0x2d) || (pbVar6 = pbVar4, bVar1 == 0x2b)) {
      this->isNegative = bVar1 == 0x2d;
      pbVar6 = pbVar4 + 1;
    }
    digit = 0;
    iVar5 = 0;
    for (; pbVar6 != pbVar4 + sVar3; pbVar6 = pbVar6 + 1) {
      if (9 < (byte)(*pbVar6 - 0x30)) {
        puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar2) {
          (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar2;
        }
        this->isNegative = false;
        return false;
      }
      digit = (digit * 10 + (uint)*pbVar6) - 0x30;
      iVar5 = iVar5 + 1;
      if (iVar5 == 7) {
        CArbitraryInteger(&local_50,10000000);
        mul(this,&local_50);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
        CArbitraryInteger(&local_50,digit);
        add(this,&local_50);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
        pbVar4 = (byte *)(text->_M_dataplus)._M_p;
        sVar3 = text->_M_string_length;
        digit = 0;
        iVar5 = 0;
      }
    }
    digit_00 = 1;
    for (; 0 < iVar5; iVar5 = iVar5 + -1) {
      digit_00 = digit_00 * 10;
    }
    CArbitraryInteger(&local_50,digit_00);
    mul(this,&local_50);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
    CArbitraryInteger(&local_50,digit);
    add(this,&local_50);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
  }
  return true;
}

Assistant:

bool CArbitraryInteger::SetValueByText( const std::string& text )
{
	Zero();
	if( text.empty() ) {
		return true;
	}
	std::string::const_iterator c = text.cbegin();
	if( *c == '-' || *c == '+' ) {
		SetSign( *c == '-' );
		++c;
	}
	TDigit digit = 0;
	const int maxDecimalDigits = 7;
	const TDigit maxDecimal = 10000000;
	static_assert( Base > maxDecimal, "too small Base" );
	int decimalCount = 0;
	for( ; c != text.cend(); ++c ) {
		if( *c >= '0' && *c <= '9' ) {
			digit = digit * 10 + ( *c - '0' );
			decimalCount++;
			if( decimalCount == maxDecimalDigits ) {
				mul( CArbitraryInteger( maxDecimal ) );
				add( CArbitraryInteger( digit ) );
				digit = 0;
				decimalCount = 0;
			}
		} else {
			Zero();
			return false;
		}
	}
	TDigit decimal = 1;
	for( ; decimalCount > 0; decimalCount-- ) {
		decimal *= 10;
	}
	mul( CArbitraryInteger( decimal ) );
	add( CArbitraryInteger( digit ) );
	return true;
}